

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

char * skip_word(char *exp,char **str)

{
  byte bVar1;
  int iVar2;
  size_t __n;
  ushort **ppuVar3;
  char *pcVar4;
  
  __n = strlen(exp);
  pcVar4 = *str;
  iVar2 = strncmp(exp,pcVar4,__n);
  if (iVar2 == 0) {
    bVar1 = pcVar4[__n];
    if (((0x2f < bVar1 - 0x2e) || ((0x800000000003U >> ((ulong)(bVar1 - 0x2e) & 0x3f) & 1) == 0)) &&
       (bVar1 != 0)) {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0) goto LAB_0010cd1e;
    }
    pcVar4 = pcVar4 + __n;
    *str = pcVar4;
  }
  else {
LAB_0010cd1e:
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

static const char* skip_word(const char* exp, const char** str)
{
    size_t explen = strlen(exp);
    const char* cur = *str;
    int match = (!strncmp(exp, cur, explen) &&
                 (   !cur[explen]
                  || cur[explen] == '/' || cur[explen] == ']'
                  || cur[explen] == '.'
                  || isspace(cur[explen])));
    if(match) {
        *str += explen;
        return *str;
    }
    else return NULL;
}